

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

void __thiscall
llm_graph_input_pos_bucket::set_input(llm_graph_input_pos_bucket *this,llama_ubatch *ubatch)

{
  char cVar1;
  int32_t iVar2;
  char *pcVar3;
  int i;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uStack_40;
  
  if (this->pos_bucket == (ggml_tensor *)0x0) {
    return;
  }
  uVar7 = (ulong)ubatch->n_tokens;
  cVar1 = ggml_backend_buffer_is_host(this->pos_bucket->buffer);
  if (cVar1 == '\0') {
    pcVar3 = "ggml_backend_buffer_is_host(pos_bucket->buffer)";
    uStack_40 = 0x52;
  }
  else {
    if (ubatch->equal_seqs != true) {
      pvVar5 = this->pos_bucket->data;
      for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
        for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          iVar2 = llama_relative_position_bucket
                            (ubatch->pos[uVar4],ubatch->pos[uVar6],
                             (ulong)this->hparams->n_rel_attn_bkts,true);
          *(int32_t *)((long)pvVar5 + uVar4 * 4) = iVar2;
        }
        pvVar5 = (void *)((long)pvVar5 + uVar7 * 4);
      }
      return;
    }
    pcVar3 = "!ubatch->equal_seqs";
    uStack_40 = 0x53;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
             ,uStack_40,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

void llm_graph_input_pos_bucket::set_input(const llama_ubatch * ubatch) {
    if (pos_bucket) {
        const int64_t n_tokens = ubatch->n_tokens;

        GGML_ASSERT(ggml_backend_buffer_is_host(pos_bucket->buffer));
        GGML_ASSERT(!ubatch->equal_seqs); // TODO: use ubatch->n_seqs instead of failing

        int32_t * data = (int32_t *) pos_bucket->data;

        for (int h = 0; h < 1; ++h) {
            for (int j = 0; j < n_tokens; ++j) {
                for (int i = 0; i < n_tokens; ++i) {
                    data[h*(n_tokens*n_tokens) + j*n_tokens + i] = llama_relative_position_bucket(ubatch->pos[i], ubatch->pos[j], hparams.n_rel_attn_bkts, true);
                }
            }
        }
    }
}